

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rnn.c
# Opt level: O0

void freedelem(rnndelem *elem)

{
  int local_14;
  int i;
  rnndelem *elem_local;
  
  cleanupvarinfo(&elem->varinfo);
  cleanuptypeinfo(&elem->typeinfo);
  for (local_14 = 0; local_14 < elem->subelemsnum; local_14 = local_14 + 1) {
    freedelem(elem->subelems[local_14]);
  }
  free(elem->subelems);
  free(elem->fullname);
  free(elem->name);
  free(elem);
  return;
}

Assistant:

static void freedelem(struct rnndelem *elem) {
	int i;
	cleanupvarinfo (&elem->varinfo);
	cleanuptypeinfo(&elem->typeinfo);
	for (i = 0; i < elem->subelemsnum; i++)
		freedelem(elem->subelems[i]);
	free(elem->subelems);

	free(elem->fullname);
	free(elem->name);
	free(elem);
}